

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_uint64 ma_dr_wav_read_pcm_frames_s16__msadpcm
                    (ma_dr_wav *pWav,ma_uint64 framesToRead,ma_int16 *pBufferOut)

{
  ushort uVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  size_t sVar5;
  ma_int32 newSample0;
  uint uVar6;
  int iVar7;
  ma_uint64 mVar8;
  uint uVar9;
  int iVar10;
  ma_uint64 mVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  ma_uint16 mVar15;
  ulong uVar16;
  ma_uint32 mVar17;
  ma_uint64 mVar18;
  ma_uint64 mVar19;
  ma_uint8 header [7];
  byte local_46;
  byte local_45;
  undefined1 uStack_44;
  undefined1 local_43;
  undefined1 uStack_42;
  undefined1 local_41;
  undefined1 uStack_40;
  undefined1 uStack_3f;
  short local_3e;
  short local_3c;
  short local_3a;
  ma_uint64 local_38;
  
  if (pWav->totalPCMFrameCount <= pWav->readCursorInPCMFrames) {
    return 0;
  }
  mVar17 = (pWav->msadpcm).cachedFrameCount;
  mVar18 = 0;
  do {
    if ((mVar17 == 0) && (mVar17 = 0, (pWav->msadpcm).bytesRemainingInBlock == 0)) {
      if (pWav->channels == 1) {
        sVar5 = (*pWav->onRead)(pWav->pUserData,&local_46,7);
        if (sVar5 != 7) {
          return mVar18;
        }
        (pWav->msadpcm).bytesRemainingInBlock = (pWav->fmt).blockAlign - 7;
        (pWav->msadpcm).predictor[0] = (ushort)local_46;
        (pWav->msadpcm).delta[0] = (int)CONCAT11(uStack_44,local_45);
        (pWav->msadpcm).prevFrames[0][1] = (int)CONCAT11(uStack_42,local_43);
        (pWav->msadpcm).prevFrames[0][0] = (int)CONCAT11(uStack_40,local_41);
        (pWav->msadpcm).cachedFrames[2] = (int)CONCAT11(uStack_40,local_41);
        (pWav->msadpcm).cachedFrames[3] = (int)CONCAT11(uStack_42,local_43);
        (pWav->msadpcm).cachedFrameCount = 2;
        mVar17 = 2;
        if (6 < local_46) {
          return mVar18;
        }
      }
      else {
        sVar5 = (*pWav->onRead)(pWav->pUserData,&local_46,0xe);
        if (sVar5 != 0xe) {
          return mVar18;
        }
        (pWav->msadpcm).bytesRemainingInBlock = (pWav->fmt).blockAlign - 0xe;
        (pWav->msadpcm).predictor[0] = (ushort)local_46;
        (pWav->msadpcm).predictor[1] = (ushort)local_45;
        (pWav->msadpcm).delta[0] = (int)CONCAT11(local_43,uStack_44);
        (pWav->msadpcm).delta[1] = (int)CONCAT11(local_41,uStack_42);
        (pWav->msadpcm).prevFrames[0][1] = (int)CONCAT11(uStack_3f,uStack_40);
        (pWav->msadpcm).prevFrames[1][1] = (int)local_3e;
        (pWav->msadpcm).prevFrames[0][0] = (int)local_3c;
        (pWav->msadpcm).prevFrames[1][0] = (int)local_3a;
        (pWav->msadpcm).cachedFrames[0] = (int)local_3c;
        (pWav->msadpcm).cachedFrames[1] = (int)local_3a;
        (pWav->msadpcm).cachedFrames[2] = (int)CONCAT11(uStack_3f,uStack_40);
        (pWav->msadpcm).cachedFrames[3] = (int)local_3e;
        (pWav->msadpcm).cachedFrameCount = 2;
        if (6 < local_46) {
          return mVar18;
        }
        mVar17 = 2;
        if (6 < local_45) {
          return mVar18;
        }
      }
    }
    if (framesToRead == 0) {
      return mVar18;
    }
    local_38 = mVar18 + mVar17;
    mVar19 = framesToRead - mVar17;
    mVar8 = mVar18;
    mVar11 = framesToRead;
    while (mVar17 != 0) {
      uVar2 = pWav->readCursorInPCMFrames;
      if (pWav->totalPCMFrameCount <= uVar2) goto LAB_00174273;
      if (pBufferOut == (ma_int16 *)0x0) {
        pBufferOut = (ma_int16 *)0x0;
      }
      else {
        mVar15 = pWav->channels;
        if (mVar15 == 0) {
          uVar16 = 0;
        }
        else {
          uVar14 = 0;
          do {
            pBufferOut[uVar14] =
                 *(ma_int16 *)((long)pWav + uVar14 * 4 + (ulong)(mVar15 * mVar17) * -4 + 0x120);
            uVar14 = uVar14 + 1;
            mVar15 = pWav->channels;
            uVar16 = (ulong)mVar15;
          } while (uVar14 < uVar16);
        }
        pBufferOut = pBufferOut + uVar16;
      }
      mVar8 = mVar8 + 1;
      pWav->readCursorInPCMFrames = uVar2 + 1;
      (pWav->msadpcm).cachedFrameCount = mVar17 - 1;
      mVar11 = mVar11 - 1;
      mVar17 = mVar17 - 1;
      if (mVar11 == 0) {
        return framesToRead + mVar18;
      }
    }
    mVar11 = mVar19;
    if ((pWav->msadpcm).bytesRemainingInBlock == 0) {
      mVar17 = 0;
      mVar8 = local_38;
    }
    else {
      sVar5 = (*pWav->onRead)(pWav->pUserData,&local_46,1);
      if (sVar5 != 1) {
        return local_38;
      }
      (pWav->msadpcm).bytesRemainingInBlock = (pWav->msadpcm).bytesRemainingInBlock - 1;
      bVar3 = local_46 >> 4;
      uVar6 = (int)(char)(bVar3 - 0x10);
      if (-1 < (char)local_46) {
        uVar6 = (uint)bVar3;
      }
      uVar4 = (uint)local_46;
      uVar9 = (int)(uVar4 << 0x1c) >> 0x1f & 0xfffffff0U | local_46 & 0xf;
      iVar13 = (pWav->msadpcm).prevFrames[0][1];
      uVar1 = (pWav->msadpcm).predictor[0];
      iVar12 = (pWav->msadpcm).delta[0];
      iVar7 = uVar6 * iVar12 +
              ((pWav->msadpcm).prevFrames[0][0] *
               ma_dr_wav_read_pcm_frames_s16__msadpcm::coeff2Table[uVar1] +
               ma_dr_wav_read_pcm_frames_s16__msadpcm::coeff1Table[uVar1] * iVar13 >> 8);
      if (0x7ffe < iVar7) {
        iVar7 = 0x7fff;
      }
      if (iVar7 < -0x7fff) {
        iVar7 = -0x8000;
      }
      iVar12 = iVar12 * ma_dr_wav_read_pcm_frames_s16__msadpcm::adaptationTable[(uint)bVar3] >> 8;
      if (iVar12 < 0x11) {
        iVar12 = 0x10;
      }
      if (pWav->channels == 1) {
        iVar10 = uVar9 * iVar12 +
                 (ma_dr_wav_read_pcm_frames_s16__msadpcm::coeff2Table[uVar1] * iVar13 +
                  ma_dr_wav_read_pcm_frames_s16__msadpcm::coeff1Table[uVar1] * iVar7 >> 8);
        if (0x7ffe < iVar10) {
          iVar10 = 0x7fff;
        }
        if (iVar10 < -0x7fff) {
          iVar10 = -0x8000;
        }
        iVar13 = iVar12 * ma_dr_wav_read_pcm_frames_s16__msadpcm::adaptationTable[uVar4 & 0xf] >> 8;
        if (iVar13 < 0x11) {
          iVar13 = 0x10;
        }
        (pWav->msadpcm).delta[0] = iVar13;
        (pWav->msadpcm).prevFrames[0][0] = iVar7;
        (pWav->msadpcm).prevFrames[0][1] = iVar10;
        mVar17 = 2;
      }
      else {
        (pWav->msadpcm).delta[0] = iVar12;
        (pWav->msadpcm).prevFrames[0][0] = iVar13;
        (pWav->msadpcm).prevFrames[0][1] = iVar7;
        iVar13 = (pWav->msadpcm).delta[1];
        iVar12 = (pWav->msadpcm).prevFrames[1][1];
        uVar1 = (pWav->msadpcm).predictor[1];
        iVar10 = uVar9 * iVar13 +
                 (ma_dr_wav_read_pcm_frames_s16__msadpcm::coeff2Table[uVar1] *
                  (pWav->msadpcm).prevFrames[1][0] +
                  ma_dr_wav_read_pcm_frames_s16__msadpcm::coeff1Table[uVar1] * iVar12 >> 8);
        if (0x7ffe < iVar10) {
          iVar10 = 0x7fff;
        }
        if (iVar10 < -0x7fff) {
          iVar10 = -0x8000;
        }
        iVar13 = iVar13 * ma_dr_wav_read_pcm_frames_s16__msadpcm::adaptationTable[uVar4 & 0xf] >> 8;
        if (iVar13 < 0x11) {
          iVar13 = 0x10;
        }
        (pWav->msadpcm).delta[1] = iVar13;
        (pWav->msadpcm).prevFrames[1][0] = iVar12;
        (pWav->msadpcm).prevFrames[1][1] = iVar10;
        mVar17 = 1;
      }
      (pWav->msadpcm).cachedFrames[2] = iVar7;
      (pWav->msadpcm).cachedFrames[3] = iVar10;
      (pWav->msadpcm).cachedFrameCount = mVar17;
      mVar8 = local_38;
    }
LAB_00174273:
    framesToRead = mVar11;
    mVar18 = mVar8;
    if (pWav->totalPCMFrameCount <= pWav->readCursorInPCMFrames) {
      return mVar8;
    }
  } while( true );
}

Assistant:

MA_PRIVATE ma_uint64 ma_dr_wav_read_pcm_frames_s16__msadpcm(ma_dr_wav* pWav, ma_uint64 framesToRead, ma_int16* pBufferOut)
{
    ma_uint64 totalFramesRead = 0;
    static ma_int32 adaptationTable[] = {
        230, 230, 230, 230, 307, 409, 512, 614,
        768, 614, 512, 409, 307, 230, 230, 230
    };
    static ma_int32 coeff1Table[] = { 256, 512, 0, 192, 240, 460,  392 };
    static ma_int32 coeff2Table[] = { 0,  -256, 0, 64,  0,  -208, -232 };
    MA_DR_WAV_ASSERT(pWav != NULL);
    MA_DR_WAV_ASSERT(framesToRead > 0);
    while (pWav->readCursorInPCMFrames < pWav->totalPCMFrameCount) {
        MA_DR_WAV_ASSERT(framesToRead > 0);
        if (pWav->msadpcm.cachedFrameCount == 0 && pWav->msadpcm.bytesRemainingInBlock == 0) {
            if (pWav->channels == 1) {
                ma_uint8 header[7];
                if (pWav->onRead(pWav->pUserData, header, sizeof(header)) != sizeof(header)) {
                    return totalFramesRead;
                }
                pWav->msadpcm.bytesRemainingInBlock = pWav->fmt.blockAlign - sizeof(header);
                pWav->msadpcm.predictor[0]     = header[0];
                pWav->msadpcm.delta[0]         = ma_dr_wav_bytes_to_s16(header + 1);
                pWav->msadpcm.prevFrames[0][1] = (ma_int32)ma_dr_wav_bytes_to_s16(header + 3);
                pWav->msadpcm.prevFrames[0][0] = (ma_int32)ma_dr_wav_bytes_to_s16(header + 5);
                pWav->msadpcm.cachedFrames[2]  = pWav->msadpcm.prevFrames[0][0];
                pWav->msadpcm.cachedFrames[3]  = pWav->msadpcm.prevFrames[0][1];
                pWav->msadpcm.cachedFrameCount = 2;
                if (pWav->msadpcm.predictor[0] >= ma_dr_wav_countof(coeff1Table)) {
                    return totalFramesRead;
                }
            } else {
                ma_uint8 header[14];
                if (pWav->onRead(pWav->pUserData, header, sizeof(header)) != sizeof(header)) {
                    return totalFramesRead;
                }
                pWav->msadpcm.bytesRemainingInBlock = pWav->fmt.blockAlign - sizeof(header);
                pWav->msadpcm.predictor[0] = header[0];
                pWav->msadpcm.predictor[1] = header[1];
                pWav->msadpcm.delta[0] = ma_dr_wav_bytes_to_s16(header + 2);
                pWav->msadpcm.delta[1] = ma_dr_wav_bytes_to_s16(header + 4);
                pWav->msadpcm.prevFrames[0][1] = (ma_int32)ma_dr_wav_bytes_to_s16(header + 6);
                pWav->msadpcm.prevFrames[1][1] = (ma_int32)ma_dr_wav_bytes_to_s16(header + 8);
                pWav->msadpcm.prevFrames[0][0] = (ma_int32)ma_dr_wav_bytes_to_s16(header + 10);
                pWav->msadpcm.prevFrames[1][0] = (ma_int32)ma_dr_wav_bytes_to_s16(header + 12);
                pWav->msadpcm.cachedFrames[0] = pWav->msadpcm.prevFrames[0][0];
                pWav->msadpcm.cachedFrames[1] = pWav->msadpcm.prevFrames[1][0];
                pWav->msadpcm.cachedFrames[2] = pWav->msadpcm.prevFrames[0][1];
                pWav->msadpcm.cachedFrames[3] = pWav->msadpcm.prevFrames[1][1];
                pWav->msadpcm.cachedFrameCount = 2;
                if (pWav->msadpcm.predictor[0] >= ma_dr_wav_countof(coeff1Table) || pWav->msadpcm.predictor[1] >= ma_dr_wav_countof(coeff2Table)) {
                    return totalFramesRead;
                }
            }
        }
        while (framesToRead > 0 && pWav->msadpcm.cachedFrameCount > 0 && pWav->readCursorInPCMFrames < pWav->totalPCMFrameCount) {
            if (pBufferOut != NULL) {
                ma_uint32 iSample = 0;
                for (iSample = 0; iSample < pWav->channels; iSample += 1) {
                    pBufferOut[iSample] = (ma_int16)pWav->msadpcm.cachedFrames[(ma_dr_wav_countof(pWav->msadpcm.cachedFrames) - (pWav->msadpcm.cachedFrameCount*pWav->channels)) + iSample];
                }
                pBufferOut += pWav->channels;
            }
            framesToRead    -= 1;
            totalFramesRead += 1;
            pWav->readCursorInPCMFrames += 1;
            pWav->msadpcm.cachedFrameCount -= 1;
        }
        if (framesToRead == 0) {
            break;
        }
        if (pWav->msadpcm.cachedFrameCount == 0) {
            if (pWav->msadpcm.bytesRemainingInBlock == 0) {
                continue;
            } else {
                ma_uint8 nibbles;
                ma_int32 nibble0;
                ma_int32 nibble1;
                if (pWav->onRead(pWav->pUserData, &nibbles, 1) != 1) {
                    return totalFramesRead;
                }
                pWav->msadpcm.bytesRemainingInBlock -= 1;
                nibble0 = ((nibbles & 0xF0) >> 4); if ((nibbles & 0x80)) { nibble0 |= 0xFFFFFFF0UL; }
                nibble1 = ((nibbles & 0x0F) >> 0); if ((nibbles & 0x08)) { nibble1 |= 0xFFFFFFF0UL; }
                if (pWav->channels == 1) {
                    ma_int32 newSample0;
                    ma_int32 newSample1;
                    newSample0  = ((pWav->msadpcm.prevFrames[0][1] * coeff1Table[pWav->msadpcm.predictor[0]]) + (pWav->msadpcm.prevFrames[0][0] * coeff2Table[pWav->msadpcm.predictor[0]])) >> 8;
                    newSample0 += nibble0 * pWav->msadpcm.delta[0];
                    newSample0  = ma_dr_wav_clamp(newSample0, -32768, 32767);
                    pWav->msadpcm.delta[0] = (adaptationTable[((nibbles & 0xF0) >> 4)] * pWav->msadpcm.delta[0]) >> 8;
                    if (pWav->msadpcm.delta[0] < 16) {
                        pWav->msadpcm.delta[0] = 16;
                    }
                    pWav->msadpcm.prevFrames[0][0] = pWav->msadpcm.prevFrames[0][1];
                    pWav->msadpcm.prevFrames[0][1] = newSample0;
                    newSample1  = ((pWav->msadpcm.prevFrames[0][1] * coeff1Table[pWav->msadpcm.predictor[0]]) + (pWav->msadpcm.prevFrames[0][0] * coeff2Table[pWav->msadpcm.predictor[0]])) >> 8;
                    newSample1 += nibble1 * pWav->msadpcm.delta[0];
                    newSample1  = ma_dr_wav_clamp(newSample1, -32768, 32767);
                    pWav->msadpcm.delta[0] = (adaptationTable[((nibbles & 0x0F) >> 0)] * pWav->msadpcm.delta[0]) >> 8;
                    if (pWav->msadpcm.delta[0] < 16) {
                        pWav->msadpcm.delta[0] = 16;
                    }
                    pWav->msadpcm.prevFrames[0][0] = pWav->msadpcm.prevFrames[0][1];
                    pWav->msadpcm.prevFrames[0][1] = newSample1;
                    pWav->msadpcm.cachedFrames[2] = newSample0;
                    pWav->msadpcm.cachedFrames[3] = newSample1;
                    pWav->msadpcm.cachedFrameCount = 2;
                } else {
                    ma_int32 newSample0;
                    ma_int32 newSample1;
                    newSample0  = ((pWav->msadpcm.prevFrames[0][1] * coeff1Table[pWav->msadpcm.predictor[0]]) + (pWav->msadpcm.prevFrames[0][0] * coeff2Table[pWav->msadpcm.predictor[0]])) >> 8;
                    newSample0 += nibble0 * pWav->msadpcm.delta[0];
                    newSample0  = ma_dr_wav_clamp(newSample0, -32768, 32767);
                    pWav->msadpcm.delta[0] = (adaptationTable[((nibbles & 0xF0) >> 4)] * pWav->msadpcm.delta[0]) >> 8;
                    if (pWav->msadpcm.delta[0] < 16) {
                        pWav->msadpcm.delta[0] = 16;
                    }
                    pWav->msadpcm.prevFrames[0][0] = pWav->msadpcm.prevFrames[0][1];
                    pWav->msadpcm.prevFrames[0][1] = newSample0;
                    newSample1  = ((pWav->msadpcm.prevFrames[1][1] * coeff1Table[pWav->msadpcm.predictor[1]]) + (pWav->msadpcm.prevFrames[1][0] * coeff2Table[pWav->msadpcm.predictor[1]])) >> 8;
                    newSample1 += nibble1 * pWav->msadpcm.delta[1];
                    newSample1  = ma_dr_wav_clamp(newSample1, -32768, 32767);
                    pWav->msadpcm.delta[1] = (adaptationTable[((nibbles & 0x0F) >> 0)] * pWav->msadpcm.delta[1]) >> 8;
                    if (pWav->msadpcm.delta[1] < 16) {
                        pWav->msadpcm.delta[1] = 16;
                    }
                    pWav->msadpcm.prevFrames[1][0] = pWav->msadpcm.prevFrames[1][1];
                    pWav->msadpcm.prevFrames[1][1] = newSample1;
                    pWav->msadpcm.cachedFrames[2] = newSample0;
                    pWav->msadpcm.cachedFrames[3] = newSample1;
                    pWav->msadpcm.cachedFrameCount = 1;
                }
            }
        }
    }
    return totalFramesRead;
}